

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDecomposition.cpp
# Opt level: O1

void __thiscall TreeDecomposition::buildFromFile(TreeDecomposition *this)

{
  ulong *puVar1;
  mapped_type mVar2;
  iterator iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  int iVar9;
  istream *piVar10;
  int *piVar11;
  ulong uVar12;
  Attribute *pAVar13;
  mapped_type *pmVar14;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar15;
  TDNode *pTVar16;
  void *__s;
  undefined8 uVar17;
  ulong uVar18;
  unsigned_long *__args;
  vector<unsigned_long,std::allocator<unsigned_long>> *ID;
  long *plVar19;
  long lVar20;
  ulong uVar21;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var22;
  long *plVar23;
  Type TVar24;
  long lVar25;
  undefined1 auVar26 [16];
  string line;
  string name;
  string node1;
  string attrs;
  string index;
  string node2;
  string eString;
  string mString;
  string nString;
  string type;
  string attribute;
  stringstream ssLine;
  ifstream input;
  char *local_5d8;
  long local_5d0;
  char local_5c8 [16];
  vector<unsigned_long,std::allocator<unsigned_long>> *local_5b8;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_5b0;
  undefined1 local_5a8 [16];
  key_type local_598;
  long *local_578;
  long local_570;
  long local_568;
  long lStack_560;
  key_type local_558;
  ulong local_538;
  long *local_530;
  long local_528;
  undefined1 local_520 [16];
  char *local_510;
  undefined8 local_508;
  char local_500 [16];
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_4f0;
  vector<Attribute_*,_std::allocator<Attribute_*>_> *local_4e8;
  key_type local_4e0;
  string local_4c0;
  undefined1 *local_4a0;
  long local_498;
  undefined1 local_490 [16];
  char *local_480;
  undefined8 local_478;
  char local_470 [16];
  char *local_460;
  undefined8 local_458;
  char local_450 [16];
  char *local_440;
  undefined8 local_438;
  char local_430 [16];
  undefined1 *local_420;
  undefined8 local_418;
  undefined1 local_410 [16];
  key_type local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  undefined1 local_3c0 [128];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream
            ((istream *)local_238,(string *)multifaq::config::TREEDECOMP_CONF_abi_cxx11_,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) goto LAB_002a272e;
  local_5d8 = local_5c8;
  local_5d0 = 0;
  local_5c8[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  local_598._M_string_length = 0;
  local_598.field_2._M_local_buf[0] = '\0';
  local_420 = local_410;
  local_418 = 0;
  local_410[0] = 0;
  local_530 = (long *)local_520;
  local_528 = 0;
  local_520[0] = 0;
  local_510 = local_500;
  local_508 = 0;
  local_500[0] = '\0';
  do {
    do {
      cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_238,(string *)&local_5d8,cVar8);
      if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) goto LAB_002a1875;
    } while (*local_5d8 == '#');
    iVar9 = std::__cxx11::string::compare((char *)&local_5d8);
  } while (iVar9 == 0);
LAB_002a1875:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_3c0 + 0x10),local_5d8,local_5d0);
  local_440 = local_430;
  local_438 = 0;
  local_430[0] = '\0';
  local_460 = local_450;
  local_458 = 0;
  local_450[0] = '\0';
  local_480 = local_470;
  local_478 = 0;
  local_470[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3c0,(string *)&local_440,' ');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3c0,(string *)&local_460,' ');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3c0,(string *)&local_480,' ');
  std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + (int)(istream *)local_3c0);
  pcVar7 = local_440;
  piVar11 = __errno_location();
  iVar9 = *piVar11;
  *piVar11 = 0;
  local_538 = strtoul(pcVar7,(char **)&local_558,10);
  if (local_558._M_dataplus._M_p == pcVar7) {
    std::__throw_invalid_argument("stoul");
  }
  else {
    if (*piVar11 == 0) {
LAB_002a198a:
      *piVar11 = iVar9;
    }
    else if (*piVar11 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_002a198a;
    }
    pcVar7 = local_460;
    iVar9 = *piVar11;
    *piVar11 = 0;
    local_5b8 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                strtoul(local_460,(char **)&local_558,10);
    if (local_558._M_dataplus._M_p != pcVar7) {
      if (*piVar11 == 0) {
LAB_002a19e1:
        *piVar11 = iVar9;
      }
      else if (*piVar11 == 0x22) {
        std::__throw_out_of_range("stoul");
        goto LAB_002a19e1;
      }
      pcVar7 = local_480;
      iVar9 = *piVar11;
      *piVar11 = 0;
      local_5b0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)strtoul(local_480,(char **)&local_558,10);
      uVar21 = local_538;
      if (local_558._M_dataplus._M_p != pcVar7) {
        if (*piVar11 != 0) {
          if (*piVar11 != 0x22) goto LAB_002a1a4c;
          std::__throw_out_of_range("stoul");
        }
        *piVar11 = iVar9;
LAB_002a1a4c:
        this->_numOfAttributes = uVar21;
        this->_numOfRelations = (size_t)local_5b8;
        this->_numOfEdges = (size_t)local_5b0;
        local_5a8._0_8_ = &this->_relations;
        std::vector<TDNode_*,_std::allocator<TDNode_*>_>::resize
                  (&this->_relations,(size_type)local_5b8);
        local_4e8 = &this->_attributes;
        std::vector<Attribute_*,_std::allocator<Attribute_*>_>::resize(local_4e8,uVar21);
        if (uVar21 != 0) {
          local_4f0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&this->_attributeMap;
          uVar21 = 0;
LAB_002a1abe:
          do {
            cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                    (char)(istream *)local_238);
            piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_238,(string *)&local_5d8,cVar8);
            if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
              if ((*local_5d8 == '#') ||
                 (iVar9 = std::__cxx11::string::compare((char *)&local_5d8), iVar9 == 0))
              goto LAB_002a1abe;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3c0 + 0x10),local_5d8,local_5d0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_510,' ');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_598,' ');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_420,' ');
            std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) +
                            (int)(istream *)local_3c0);
            pcVar7 = local_510;
            iVar9 = *piVar11;
            *piVar11 = 0;
            uVar12 = strtoul(local_510,(char **)&local_558,10);
            if (local_558._M_dataplus._M_p == pcVar7) {
              std::__throw_invalid_argument("stoul");
              goto LAB_002a26ec;
            }
            if (*piVar11 == 0) {
              *piVar11 = iVar9;
            }
            else if (*piVar11 == 0x22) goto LAB_002a2713;
            if (uVar21 != uVar12) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Inconsistent index specified in your DTree config file.\n",0x38);
            }
            iVar9 = std::__cxx11::string::compare((char *)&local_420);
            TVar24 = (Type)(iVar9 == 0);
            iVar9 = std::__cxx11::string::compare((char *)&local_420);
            if (iVar9 == 0) {
              TVar24 = Short;
            }
            iVar9 = std::__cxx11::string::compare((char *)&local_420);
            if (iVar9 == 0) {
              TVar24 = U_Integer;
            }
            pAVar13 = (Attribute *)operator_new(0x40);
            local_4a0 = local_490;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4a0,local_598._M_dataplus._M_p,
                       local_598._M_dataplus._M_p + local_598._M_string_length);
            pAVar13->_id = (int)uVar21;
            (pAVar13->_name)._M_dataplus._M_p = (pointer)&(pAVar13->_name).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pAVar13->_name,local_4a0,local_4a0 + local_498);
            pAVar13->_type = TVar24;
            (pAVar13->_constant).first = false;
            (pAVar13->_constant).second = 0.0;
            (local_4e8->super__Vector_base<Attribute_*,_std::allocator<Attribute_*>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar21] = pAVar13;
            if (local_4a0 != local_490) {
              operator_delete(local_4a0);
            }
            pmVar14 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_4f0,&local_598);
            *pmVar14 = uVar21;
            uVar21 = uVar21 + 1;
          } while (uVar21 != local_538);
        }
        if (local_5b8 != (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
          ID = (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0;
LAB_002a1d3d:
          do {
            cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                    (char)(istream *)local_238);
            piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_238,(string *)&local_5d8,cVar8);
            if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
              if ((*local_5d8 == '#') ||
                 (iVar9 = std::__cxx11::string::compare((char *)&local_5d8), iVar9 == 0))
              goto LAB_002a1d3d;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3c0 + 0x10),local_5d8,local_5d0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_510,' ');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_598,':');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_530,' ');
            pcVar7 = local_510;
            iVar9 = *piVar11;
            *piVar11 = 0;
            pvVar15 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      strtoul(local_510,(char **)&local_558,10);
            if (local_558._M_dataplus._M_p == pcVar7) goto LAB_002a26ec;
            if (*piVar11 == 0) {
              *piVar11 = iVar9;
            }
            else if (*piVar11 == 0x22) goto LAB_002a271f;
            if (ID != pvVar15) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Inconsistent index specified in your DTree config file.\n",0x38);
            }
            pTVar16 = (TDNode *)operator_new(0x70);
            local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4c0,local_598._M_dataplus._M_p,
                       local_598._M_dataplus._M_p + local_598._M_string_length);
            TDNode::TDNode(pTVar16,&local_4c0,(size_t)ID);
            *(TDNode **)(*(long *)local_5a8._0_8_ + (long)ID * 8) = pTVar16;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
              operator_delete(local_4c0._M_dataplus._M_p);
            }
            pmVar14 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->_relationsMap,&local_598);
            *pmVar14 = (mapped_type)ID;
            iVar9 = (int)(istream *)local_3c0;
            std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + iVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3c0 + 0x10),(char *)local_530,local_528);
            while (piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                       ((istream *)local_3c0,(string *)&local_400,','),
                  ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
              lVar20 = *(long *)(*(long *)local_5a8._0_8_ + (long)ID * 8);
              pmVar14 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&this->_attributeMap,&local_400);
              uVar21 = *pmVar14;
              if (99 < uVar21) {
                std::__throw_out_of_range_fmt
                          ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                           uVar21,100);
              }
              puVar1 = (ulong *)(lVar20 + 0x50 + (uVar21 >> 6) * 8);
              *puVar1 = *puVar1 | 1L << ((byte)uVar21 & 0x3f);
            }
            std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + iVar9);
            ID = ID + 1;
          } while (ID != local_5b8);
        }
        local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
        local_558._M_string_length = 0;
        local_558.field_2._M_local_buf[0] = '\0';
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        local_4e0._M_string_length = 0;
        local_4e0.field_2._M_local_buf[0] = '\0';
        if (local_5b0 !=
            (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)0x0) {
          p_Var22 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)0x0;
          do {
            do {
              cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                      (char)(istream *)local_238);
              piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)local_238,(string *)&local_5d8,cVar8);
              if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
            } while ((*local_5d8 == '#') ||
                    (iVar9 = std::__cxx11::string::compare((char *)&local_5d8), iVar9 == 0));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3c0 + 0x10),local_5d8,local_5d0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_558,'-');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_4e0,' ');
            pmVar14 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->_relationsMap,&local_558);
            mVar2 = *pmVar14;
            pmVar14 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->_relationsMap,&local_4e0);
            plVar19 = (long *)(long)(int)*pmVar14;
            plVar23 = (long *)(long)(int)mVar2;
            lVar20 = *(long *)(*(long *)local_5a8._0_8_ + (long)plVar23 * 8);
            iVar3._M_current = *(unsigned_long **)(lVar20 + 0x40);
            if (iVar3._M_current == *(unsigned_long **)(lVar20 + 0x48)) {
              local_578 = plVar19;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar20 + 0x38),
                         iVar3,(unsigned_long *)&local_578);
            }
            else {
              *iVar3._M_current = (unsigned_long)plVar19;
              *(unsigned_long **)(lVar20 + 0x40) = iVar3._M_current + 1;
            }
            lVar20 = *(long *)(*(long *)local_5a8._0_8_ + (long)plVar19 * 8);
            iVar3._M_current = *(unsigned_long **)(lVar20 + 0x40);
            local_578 = plVar23;
            if (iVar3._M_current == *(unsigned_long **)(lVar20 + 0x48)) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar20 + 0x38),
                         iVar3,(unsigned_long *)&local_578);
            }
            else {
              *iVar3._M_current = (unsigned_long)plVar23;
              *(unsigned_long **)(lVar20 + 0x40) = iVar3._M_current + 1;
            }
            std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + (int)local_3c0);
            p_Var22 = p_Var22 + 1;
          } while (p_Var22 != local_5b0);
        }
        if (this->_numOfRelations != 0) {
          local_5b8 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->_leafNodes;
          local_5b0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&this->_relationsMap;
          uVar21 = 0;
          do {
            lVar20 = *(long *)local_5a8._0_8_;
            lVar4 = *(long *)(lVar20 + uVar21 * 8);
            lVar5 = *(long *)(lVar4 + 0x38);
            lVar6 = *(long *)(lVar4 + 0x40);
            lVar25 = lVar6 - lVar5;
            uVar18 = lVar25 >> 3;
            *(ulong *)(lVar4 + 0x30) = uVar18;
            uVar12 = lVar25 * 2;
            __s = operator_new__(-(ulong)(uVar18 >> 0x3c != 0) | uVar12);
            if (lVar6 != lVar5) {
              memset(__s,0,uVar12 & 0xfffffffffffffff0);
            }
            *(void **)(*(long *)(lVar20 + uVar21 * 8) + 0x60) = __s;
            lVar20 = *(long *)(lVar20 + uVar21 * 8);
            if ((*(long *)(lVar20 + 0x30) == 1) || (this->_numOfRelations == 1)) {
              __args = (unsigned_long *)(lVar20 + 0x20);
              iVar3._M_current =
                   (this->_leafNodes).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->_leafNodes).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(local_5b8,iVar3,__args);
              }
              else {
                *iVar3._M_current = *__args;
                (this->_leafNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
            }
            do {
              cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                      (char)(istream *)local_238);
              piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)local_238,(string *)&local_5d8,cVar8);
              if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
            } while ((*local_5d8 == '#') ||
                    (iVar9 = std::__cxx11::string::compare((char *)&local_5d8), iVar9 == 0));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3c0 + 0x10),local_5d8,local_5d0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_598,' ');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_530,' ');
            pmVar14 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_5b0,&local_598);
            plVar19 = local_530;
            mVar2 = *pmVar14;
            iVar9 = *piVar11;
            *piVar11 = 0;
            uVar12 = strtol((char *)local_530,(char **)&local_578,10);
            if (local_578 == plVar19) goto LAB_002a26fb;
            if (((long)(int)uVar12 != uVar12) || (*piVar11 == 0x22)) goto LAB_002a2707;
            if (*piVar11 == 0) {
              *piVar11 = iVar9;
            }
            if ((int)mVar2 == -1) {
              std::operator+(&local_3e0,"The relation ",&local_598);
              plVar19 = (long *)std::__cxx11::string::append((char *)&local_3e0);
              plVar23 = plVar19 + 2;
              if ((long *)*plVar19 == plVar23) {
                local_568 = *plVar23;
                lStack_560 = plVar19[3];
                local_578 = &local_568;
              }
              else {
                local_568 = *plVar23;
                local_578 = (long *)*plVar19;
              }
              local_570 = plVar19[1];
              *plVar19 = (long)plVar23;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_578,local_570);
              if (local_578 != &local_568) {
                operator_delete(local_578);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                operator_delete(local_3e0._M_dataplus._M_p);
              }
            }
            if ((uVar12 & 0xfffffffe) != 0) {
              *(long *)(*(long *)(*(long *)local_5a8._0_8_ + (long)(int)mVar2 * 8) + 0x68) =
                   (long)(int)uVar12;
            }
            std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + (int)local_3c0);
            uVar21 = uVar21 + 1;
          } while (uVar21 < this->_numOfRelations);
        }
        pTVar16 = *(this->_relations).super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        this->_root = pTVar16;
        auVar26 = *(undefined1 (*) [16])(pTVar16->_bag).super__Base_bitset<2UL>._M_w;
        if (pTVar16->_numOfNeighbors != 0) {
          lVar20 = 0;
          uVar21 = 0;
          do {
            local_5a8 = auVar26;
            neighborSchema(this,(this->_relations).
                                super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>._M_impl.
                                super__Vector_impl_data._M_start
                                [(pTVar16->_neighbors).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar21]],pTVar16->_id,
                           (var_bitset *)
                           ((long)(pTVar16->_neighborSchema->super__Base_bitset<2UL>)._M_w + lVar20)
                          );
            pTVar16 = this->_root;
            auVar26 = local_5a8 |
                      *(undefined1 (*) [16])
                       ((long)(pTVar16->_neighborSchema->super__Base_bitset<2UL>)._M_w + lVar20);
            uVar21 = uVar21 + 1;
            lVar20 = lVar20 + 0x10;
          } while (uVar21 < pTVar16->_numOfNeighbors);
        }
        pTVar16 = this->_root;
        if (pTVar16->_numOfNeighbors != 0) {
          lVar20 = 0;
          uVar21 = 0;
          local_5a8 = auVar26;
          do {
            puVar1 = (ulong *)((long)(pTVar16->_neighborSchema->super__Base_bitset<2UL>)._M_w +
                              lVar20);
            auVar26._0_8_ = *puVar1 ^ 0xffffffffffffffff;
            auVar26._8_8_ = (puVar1[1] ^ 0xffffffffffffffff) & (ulong)DAT_002b26a0;
            parentNeighborSchema
                      (this,(this->_relations).
                            super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [(pTVar16->_neighbors).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar21]],pTVar16->_id,
                       (var_bitset)
                       (*(undefined1 (*) [16])(pTVar16->_bag).super__Base_bitset<2UL>._M_w |
                       auVar26 & local_5a8));
            uVar21 = uVar21 + 1;
            pTVar16 = this->_root;
            lVar20 = lVar20 + 0x10;
          } while (uVar21 < pTVar16->_numOfNeighbors);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p);
        }
        if (local_480 != local_470) {
          operator_delete(local_480);
        }
        if (local_460 != local_450) {
          operator_delete(local_460);
        }
        if (local_440 != local_430) {
          operator_delete(local_440);
        }
        if (local_510 != local_500) {
          operator_delete(local_510);
        }
        if (local_530 != (long *)local_520) {
          operator_delete(local_530);
        }
        if (local_420 != local_410) {
          operator_delete(local_420);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._M_dataplus._M_p != &local_400.field_2) {
          operator_delete(local_400._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
        std::ios_base::~ios_base(local_340);
        if (local_5d8 != local_5c8) {
          operator_delete(local_5d8);
        }
        std::ifstream::~ifstream(local_238);
        return;
      }
      goto LAB_002a278c;
    }
  }
  std::__throw_invalid_argument("stoul");
LAB_002a278c:
  uVar17 = std::__throw_invalid_argument("stoul");
  if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
    operator_delete((void *)local_3c0._0_8_);
  }
  std::ifstream::~ifstream(local_238);
  _Unwind_Resume(uVar17);
LAB_002a26ec:
  std::__throw_invalid_argument("stoul");
LAB_002a26fb:
  std::__throw_invalid_argument("stoi");
LAB_002a2707:
  std::__throw_out_of_range("stoi");
LAB_002a2713:
  std::__throw_out_of_range("stoul");
LAB_002a271f:
  std::__throw_out_of_range("stoul");
LAB_002a272e:
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::config::TREEDECOMP_CONF_abi_cxx11_," does not exist. \n");
  std::operator<<((ostream *)&std::cerr,(string *)local_3c0);
  std::__cxx11::string::~string((string *)local_3c0);
  exit(1);
}

Assistant:

void TreeDecomposition::buildFromFile()
{
    /* Load the TreeDecomposition config file into an input stream. */
    std::ifstream input(multifaq::config::TREEDECOMP_CONF);

    if (!input)
    {
        ERROR(multifaq::config::TREEDECOMP_CONF+" does not exist. \n");
        exit(1);
    }

    DINFO("Building the TD from file: " << multifaq::config::TREEDECOMP_CONF << " ... ");
   
    /* Number of attributes and tables. */
    size_t n, m, e;

    /* String and associated stream to receive lines from the file. */
    std::string line;
    std::stringstream ssLine;

    /* String to receive the attributes from the relation. */
    std::string attribute;

    /* Read all the attributes - name and value - and parent and key. */
    std::string name;
    std::string type;
    std::string attrs;
    std::string index;
    
    /* Skmaip any comments at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;
    
        break;
    }

    /* Extract number of attributes and tables. */
    ssLine << line;

    std::string nString, mString, eString;
    getline(ssLine, nString, PARAMETER_SEPARATOR_CHAR);
    getline(ssLine, mString, PARAMETER_SEPARATOR_CHAR);
    getline(ssLine, eString, PARAMETER_SEPARATOR_CHAR);
   
    ssLine.clear();

    /* Convert the strings to integers. */
    n = stoul(nString);
    m = stoul(mString);
    e = stoul(eString);

    /* Set numOfAttributes and _numOfRelations. */
    this->_numOfAttributes = n;
    this->_numOfRelations = m;
    this->_numOfEdges = e;

    this->_relations.resize(m);
    // this->_attributesInRelation.resize(m);
    this->_attributes.resize(n);
   
    for (size_t i = 0; i < n; ++i)
    {
        /* Extract node information for each attribute. */
        while (getline(input, line))
        {
            if (line[0] == COMMENT_CHAR || line == "")
                continue;

            break;
        }

        ssLine << line;

        /* Get the six parameters specified for each attribute. */
        getline(ssLine, index, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, type, PARAMETER_SEPARATOR_CHAR);

        /* Clear string stream. */
        ssLine.clear();

        if (i != stoul(index))
            ERROR("Inconsistent index specified in your DTree config file.\n");

        Type t = Type::Integer;        
        if (type.compare("double")==0) t = Type::Double;
        if (type.compare("short")==0) t = Type::Short;
        if (type.compare("uint")==0) t = Type::U_Integer;
        
        this->_attributes[i] = new Attribute(name, i, t);
        this->_attributeMap[name] = i;
    }
  
    /* Read all the node names, their parents and attributes. */
    for (size_t i = 0; i < m; ++i)
    {
        /* Extract node information for each relation. */
        while (getline(input, line))
        {
           if (line[0] == COMMENT_CHAR || line == "")
              continue;

           break;
        }

        ssLine << line;

        /* Get the three parameters specified for each relation. */
        // getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        // getline(ssLine, parent, PARAMETER_SEPARATOR_CHAR);

        getline(ssLine, index, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, name, NAME_SEPARATOR_CHAR);
        getline(ssLine, attrs, PARAMETER_SEPARATOR_CHAR);

        if (i != stoul(index))
            ERROR("Inconsistent index specified in your DTree config file.\n");

#ifdef PRINT_TD
        DINFO( index << " " << name << " " << attrs << "\n");
#endif
        this->_relations[i] = new TDNode(name, i);
        this->_relationsMap[name] = i;

        /* Clear string stream. */
        ssLine.clear();

        ssLine << attrs;

        while (getline(ssLine, attribute, ATTRIBUTE_SEPARATOR_CHAR))
            this->_relations[i]->_bag.set(_attributeMap[attribute]);
        
        /* Clear string stream. */
        ssLine.clear();
    }

    std::string node1, node2;
    
    /* Read all the node names, their parents and attributes. */
    for (size_t i = 0; i < e; ++i)
    {
        /* Extract node information for each relation. */
        while (getline(input, line))
        {
           if (line[0] == COMMENT_CHAR || line == "")
              continue;

           break;
        }

        ssLine << line;

        getline(ssLine, node1, EDGE_SEPARATOR_CHAR);
        getline(ssLine, node2, PARAMETER_SEPARATOR_CHAR);

#ifdef PRINT_TD
        DINFO( node1 << " - " << node2 << "\n");
#endif

        int n1 = _relationsMap[node1];
        int n2 = _relationsMap[node2];

        _relations[n1]->_neighbors.push_back(n2);
        _relations[n2]->_neighbors.push_back(n1);

        ssLine.clear();
    }
    
    for (size_t i = 0; i < _numOfRelations; i++)
    {
        _relations[i]->_numOfNeighbors = _relations[i]->_neighbors.size();
        _relations[i]->_neighborSchema = new var_bitset[_relations[i]->_numOfNeighbors];
        
        if (_relations[i]->_numOfNeighbors == 1 || _numOfRelations == 1)
            _leafNodes.push_back(_relations[i]->_id);


        /* Extract node information for each relation. */
        while (getline(input, line))
        {
            if (line[0] == COMMENT_CHAR || line == "")
                continue;

            break;
        }

        ssLine << line;

        getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, attrs, PARAMETER_SEPARATOR_CHAR);

#ifdef PRINT_TD        
        DINFO( name << " - " << attrs << "\n");
#endif
        int relID = _relationsMap[name];
        size_t threads = std::stoi(attrs);

        if (relID == -1)
            ERROR("The relation "+name+" was not found\n");
        
        if (threads > 1)
        {
            this->_relations[relID]->_threads = threads;
        }
        
        ssLine.clear();
    }
    
    // We are computing the schema!    
    this->_root = _relations[0];
    var_bitset rootSchemaBitset = _root->_bag;
    
    /* Setting neighborSchema for root node! */
    for (size_t n = 0; n < _root->_numOfNeighbors; n++)
    {
        neighborSchema(getRelation(_root->_neighbors[n]), _root->_id,
                       _root->_neighborSchema[n]);

        rootSchemaBitset |= _root->_neighborSchema[n];
    }

    /* Propagating schema down */
    for (size_t n = 0; n < _root->_numOfNeighbors; n++)
    {
        parentNeighborSchema(
            getRelation(_root->_neighbors[n]), _root->_id,
            (rootSchemaBitset & ~_root->_neighborSchema[n]) | _root->_bag);
    }
 
    // for (size_t i = 0; i < _numOfRelations; i++)
    // {
    //     printf("node: %s : ", getRelation(i)->_name.c_str());
    //     std::cout << getRelation(i)->_bag << "\n";
    //     for (size_t c = 0; c < getRelation(i)->_numOfNeighbors; c++)
    //         std::cout <<getRelation(i)->_neighborSchema[c] << " | ";
    //     std::cout << "\n";
    // }
}